

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

ssize_t __thiscall asl::Socket_::read(Socket_ *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ssize_t sVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  uVar3 = 0;
  uVar4 = (ulong)__buf & 0xffffffff;
  do {
    sVar2 = ::read(*(int *)&(this->super_SmartObject_).field_0xc,__buf_00,(long)(int)uVar4);
    uVar1 = (uint)sVar2;
    if (this->_blocking != true) break;
    if ((int)uVar1 < 1) {
      this->_error = 5;
      uVar1 = uVar3;
      break;
    }
    __buf_00 = (void *)((long)__buf_00 + (ulong)(uVar1 & 0x7fffffff));
    uVar3 = uVar3 + uVar1;
    uVar4 = (ulong)((int)uVar4 - uVar1);
    uVar1 = uVar3;
  } while ((int)uVar3 < (int)__buf);
  return (ulong)uVar1;
}

Assistant:

int Socket_::read(void* data, int size)
{
		int s = 0, size0 = size;
		do
		{
#ifdef _WIN32
		int n = recv(_handle, (char*)data, size, 0);
#else
		int n = ::read(_handle, (char*)data, size);
#endif
		if (!_blocking)
			return n;
			if (n <= 0)
			{
			_error = SOCKET_BAD_RECV;
			break;
		}
		data = (char*)data + n;
		s += n;
		size -= n;
		} while (s < size0);
	return s;
	}